

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O1

BOOL __thiscall
Js::DynamicObject::GetObjectArrayItem
          (DynamicObject *this,Var originalInstance,uint32 index,Var *value,
          ScriptContext *requestContext)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  RecyclableObject *pRVar4;
  
  pRVar4 = ScriptContext::GetMissingItemResult(requestContext);
  *value = pRVar4;
  bVar1 = HasObjectArray(this);
  uVar2 = 0;
  if (bVar1) {
    iVar3 = (**(code **)(**(long **)&(this->field_1).field_1 + 0x130))
                      (*(long **)&(this->field_1).field_1,originalInstance,index,value,
                       requestContext);
    uVar2 = (uint)(iVar3 == 1);
  }
  return uVar2;
}

Assistant:

BOOL DynamicObject::GetObjectArrayItem(Var originalInstance, uint32 index, Var* value, ScriptContext* requestContext)
    {
        *value = requestContext->GetMissingItemResult();
        return HasObjectArray() && GetObjectArrayOrFlagsAsArray()->GetItem(originalInstance, index, value, requestContext);
    }